

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_io.cpp
# Opt level: O0

adios2_error
adios2_inquire_all_attributes(adios2_attribute ***attributes,size_t *size,adios2_io *io)

{
  DataType DVar1;
  undefined8 uVar2;
  bool bVar3;
  DataType DVar4;
  DataType DVar5;
  size_type sVar6;
  pointer pAVar7;
  undefined8 in_RDX;
  size_t *in_RSI;
  undefined8 *in_RDI;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar8;
  AttributeBase *attribute;
  DataType type;
  const_iterator it_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *name;
  iterator __end2_1;
  iterator __begin2_1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_1;
  size_t n;
  value_type *it;
  const_iterator __end2;
  const_iterator __begin2;
  AttrMap *__range2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  adios2_attribute **list;
  AttrMap *dataMap;
  IO *ioCpp;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>_>
  *in_stack_fffffffffffff788;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffff790;
  value_type *in_stack_fffffffffffff7a8;
  reference pbVar9;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffff7b0;
  allocator *paVar10;
  string *in_stack_fffffffffffff848;
  adios2_io *in_stack_fffffffffffff850;
  allocator local_5b9;
  string local_5b8 [39];
  allocator local_591;
  string local_590 [39];
  allocator local_569;
  string local_568 [39];
  allocator local_541;
  string local_540 [39];
  allocator local_519;
  string local_518 [39];
  allocator local_4f1;
  string local_4f0 [39];
  allocator local_4c9;
  string local_4c8 [39];
  allocator local_4a1;
  string local_4a0 [39];
  allocator local_479;
  string local_478 [39];
  allocator local_451;
  string local_450 [39];
  allocator local_429;
  string local_428 [39];
  allocator local_401;
  string local_400 [39];
  allocator local_3d9;
  string local_3d8 [39];
  allocator local_3b1;
  string local_3b0 [39];
  allocator local_389;
  string local_388 [39];
  allocator local_361;
  string local_360 [39];
  allocator local_339;
  string local_338 [39];
  allocator local_311;
  string local_310 [39];
  allocator local_2e9;
  string local_2e8 [39];
  allocator local_2c1;
  string local_2c0 [39];
  allocator local_299;
  string local_298 [39];
  allocator local_271;
  string local_270 [39];
  allocator local_249;
  string local_248 [39];
  allocator local_221;
  string local_220 [39];
  allocator local_1f9;
  string local_1f8 [39];
  allocator local_1d1;
  string local_1d0 [39];
  allocator local_1a9;
  string local_1a8 [39];
  allocator local_181;
  string local_180 [39];
  allocator local_159;
  string local_158 [39];
  allocator local_131;
  string local_130 [32];
  Attribute *local_110;
  DataType local_104;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_true>
  local_100;
  reference local_f8;
  _Self local_f0;
  _Self local_e8;
  undefined1 *local_e0;
  long local_d8;
  _Base_ptr local_d0;
  undefined1 local_c8;
  reference local_c0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_true>
  local_b8;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_true>
  local_b0;
  undefined8 local_a8;
  undefined1 local_a0 [48];
  void *local_70;
  undefined8 local_68;
  undefined8 local_60;
  allocator local_41;
  string local_40 [32];
  undefined8 local_20;
  size_t *local_18;
  undefined8 *local_10;
  adios2_error local_4;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_40,"for adios2_io, in call to adios2_inquire_all_attributes",&local_41);
  adios2::helper::CheckForNullptr<adios2_io>(in_stack_fffffffffffff850,in_stack_fffffffffffff848);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  local_60 = local_20;
  local_68 = adios2::core::IO::GetAttributes_abi_cxx11_();
  sVar6 = std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>_>
          ::size((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>_>
                  *)0x14cd35);
  *local_18 = sVar6;
  local_70 = calloc(*local_18,8);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x14cd6d);
  local_a8 = local_68;
  local_b0._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>_>
       ::begin(in_stack_fffffffffffff788);
  local_b8._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>_>
       ::end(in_stack_fffffffffffff788);
  while (bVar3 = std::__detail::operator!=(&local_b0,&local_b8), bVar3) {
    local_c0 = std::__detail::
               _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
               ::operator*((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                            *)0x14cdd2);
    pVar8 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
    local_d0 = (_Base_ptr)pVar8.first._M_node;
    local_c8 = pVar8.second;
    std::__detail::
    _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
    ::operator++((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                  *)in_stack_fffffffffffff790);
  }
  local_d8 = 0;
  local_e0 = local_a0;
  local_e8._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffff788);
  local_f0._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffff788);
  while (bVar3 = std::operator!=(&local_e8,&local_f0), bVar3) {
    local_f8 = std::
               _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)0x14cf03);
    local_100._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>_>
         ::find(in_stack_fffffffffffff788,(key_type *)0x14cf20);
    std::__detail::
    _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
    ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                  *)0x14cf47);
    pAVar7 = std::
             unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>
             ::operator->((unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>
                           *)0x14cf53);
    DVar1 = *(DataType *)(pAVar7 + 0x28);
    local_110 = (Attribute *)0x0;
    local_104 = DVar1;
    if (DVar1 != Struct) {
      DVar4 = adios2::helper::GetDataType<std::__cxx11::string>();
      uVar2 = local_60;
      pbVar9 = local_f8;
      DVar5 = local_104;
      if (DVar1 == DVar4) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_130,"",&local_131);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_158,"/",&local_159);
        local_110 = adios2::core::IO::InquireAttribute<std::__cxx11::string>
                              (uVar2,pbVar9,local_130,local_158);
        std::__cxx11::string::~string(local_158);
        std::allocator<char>::~allocator((allocator<char> *)&local_159);
        std::__cxx11::string::~string(local_130);
        std::allocator<char>::~allocator((allocator<char> *)&local_131);
        *(Attribute **)((long)local_70 + local_d8 * 8) = local_110;
      }
      else {
        DVar4 = adios2::helper::GetDataType<char>();
        uVar2 = local_60;
        pbVar9 = local_f8;
        DVar1 = local_104;
        if (DVar5 == DVar4) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_180,"",&local_181);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_1a8,"/",&local_1a9);
          local_110 = adios2::core::IO::InquireAttribute<char>(uVar2,pbVar9,local_180,local_1a8);
          std::__cxx11::string::~string(local_1a8);
          std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
          std::__cxx11::string::~string(local_180);
          std::allocator<char>::~allocator((allocator<char> *)&local_181);
          *(Attribute **)((long)local_70 + local_d8 * 8) = local_110;
        }
        else {
          DVar4 = adios2::helper::GetDataType<signed_char>();
          uVar2 = local_60;
          pbVar9 = local_f8;
          DVar5 = local_104;
          if (DVar1 == DVar4) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_1d0,"",&local_1d1);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_1f8,"/",&local_1f9);
            local_110 = adios2::core::IO::InquireAttribute<signed_char>
                                  (uVar2,pbVar9,local_1d0,local_1f8);
            std::__cxx11::string::~string(local_1f8);
            std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
            std::__cxx11::string::~string(local_1d0);
            std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
            *(Attribute **)((long)local_70 + local_d8 * 8) = local_110;
          }
          else {
            DVar4 = adios2::helper::GetDataType<short>();
            uVar2 = local_60;
            pbVar9 = local_f8;
            DVar1 = local_104;
            if (DVar5 == DVar4) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_220,"",&local_221);
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_248,"/",&local_249);
              local_110 = adios2::core::IO::InquireAttribute<short>
                                    (uVar2,pbVar9,local_220,local_248);
              std::__cxx11::string::~string(local_248);
              std::allocator<char>::~allocator((allocator<char> *)&local_249);
              std::__cxx11::string::~string(local_220);
              std::allocator<char>::~allocator((allocator<char> *)&local_221);
              *(Attribute **)((long)local_70 + local_d8 * 8) = local_110;
            }
            else {
              DVar4 = adios2::helper::GetDataType<int>();
              uVar2 = local_60;
              pbVar9 = local_f8;
              DVar5 = local_104;
              if (DVar1 == DVar4) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_270,"",&local_271);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_298,"/",&local_299);
                local_110 = adios2::core::IO::InquireAttribute<int>
                                      (uVar2,pbVar9,local_270,local_298);
                std::__cxx11::string::~string(local_298);
                std::allocator<char>::~allocator((allocator<char> *)&local_299);
                std::__cxx11::string::~string(local_270);
                std::allocator<char>::~allocator((allocator<char> *)&local_271);
                *(Attribute **)((long)local_70 + local_d8 * 8) = local_110;
              }
              else {
                DVar4 = adios2::helper::GetDataType<long>();
                uVar2 = local_60;
                pbVar9 = local_f8;
                DVar1 = local_104;
                if (DVar5 == DVar4) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string(local_2c0,"",&local_2c1);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string(local_2e8,"/",&local_2e9);
                  local_110 = adios2::core::IO::InquireAttribute<long>
                                        (uVar2,pbVar9,local_2c0,local_2e8);
                  std::__cxx11::string::~string(local_2e8);
                  std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
                  std::__cxx11::string::~string(local_2c0);
                  std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
                  *(Attribute **)((long)local_70 + local_d8 * 8) = local_110;
                }
                else {
                  DVar4 = adios2::helper::GetDataType<unsigned_char>();
                  uVar2 = local_60;
                  pbVar9 = local_f8;
                  DVar5 = local_104;
                  if (DVar1 == DVar4) {
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string(local_310,"",&local_311);
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string(local_338,"/",&local_339);
                    local_110 = adios2::core::IO::InquireAttribute<unsigned_char>
                                          (uVar2,pbVar9,local_310,local_338);
                    std::__cxx11::string::~string(local_338);
                    std::allocator<char>::~allocator((allocator<char> *)&local_339);
                    std::__cxx11::string::~string(local_310);
                    std::allocator<char>::~allocator((allocator<char> *)&local_311);
                    *(Attribute **)((long)local_70 + local_d8 * 8) = local_110;
                  }
                  else {
                    DVar4 = adios2::helper::GetDataType<unsigned_short>();
                    uVar2 = local_60;
                    pbVar9 = local_f8;
                    DVar1 = local_104;
                    if (DVar5 == DVar4) {
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string(local_360,"",&local_361);
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string(local_388,"/",&local_389);
                      local_110 = adios2::core::IO::InquireAttribute<unsigned_short>
                                            (uVar2,pbVar9,local_360,local_388);
                      std::__cxx11::string::~string(local_388);
                      std::allocator<char>::~allocator((allocator<char> *)&local_389);
                      std::__cxx11::string::~string(local_360);
                      std::allocator<char>::~allocator((allocator<char> *)&local_361);
                      *(Attribute **)((long)local_70 + local_d8 * 8) = local_110;
                    }
                    else {
                      DVar4 = adios2::helper::GetDataType<unsigned_int>();
                      uVar2 = local_60;
                      pbVar9 = local_f8;
                      DVar5 = local_104;
                      if (DVar1 == DVar4) {
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string(local_3b0,"",&local_3b1);
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string(local_3d8,"/",&local_3d9);
                        local_110 = adios2::core::IO::InquireAttribute<unsigned_int>
                                              (uVar2,pbVar9,local_3b0,local_3d8);
                        std::__cxx11::string::~string(local_3d8);
                        std::allocator<char>::~allocator((allocator<char> *)&local_3d9);
                        std::__cxx11::string::~string(local_3b0);
                        std::allocator<char>::~allocator((allocator<char> *)&local_3b1);
                        *(Attribute **)((long)local_70 + local_d8 * 8) = local_110;
                      }
                      else {
                        DVar4 = adios2::helper::GetDataType<unsigned_long>();
                        uVar2 = local_60;
                        pbVar9 = local_f8;
                        DVar1 = local_104;
                        if (DVar5 == DVar4) {
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string(local_400,"",&local_401);
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string(local_428,"/",&local_429);
                          local_110 = adios2::core::IO::InquireAttribute<unsigned_long>
                                                (uVar2,pbVar9,local_400,local_428);
                          std::__cxx11::string::~string(local_428);
                          std::allocator<char>::~allocator((allocator<char> *)&local_429);
                          std::__cxx11::string::~string(local_400);
                          std::allocator<char>::~allocator((allocator<char> *)&local_401);
                          *(Attribute **)((long)local_70 + local_d8 * 8) = local_110;
                        }
                        else {
                          DVar4 = adios2::helper::GetDataType<float>();
                          uVar2 = local_60;
                          DVar5 = local_104;
                          if (DVar1 == DVar4) {
                            paVar10 = &local_451;
                            pbVar9 = local_f8;
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string(local_450,"",paVar10);
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string(local_478,"/",&local_479);
                            local_110 = adios2::core::IO::InquireAttribute<float>
                                                  (uVar2,pbVar9,local_450,local_478);
                            std::__cxx11::string::~string(local_478);
                            std::allocator<char>::~allocator((allocator<char> *)&local_479);
                            std::__cxx11::string::~string(local_450);
                            std::allocator<char>::~allocator((allocator<char> *)&local_451);
                            *(Attribute **)((long)local_70 + local_d8 * 8) = local_110;
                          }
                          else {
                            DVar4 = adios2::helper::GetDataType<double>();
                            uVar2 = local_60;
                            pbVar9 = local_f8;
                            DVar1 = local_104;
                            if (DVar5 == DVar4) {
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string(local_4a0,"",&local_4a1);
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string(local_4c8,"/",&local_4c9);
                              local_110 = adios2::core::IO::InquireAttribute<double>
                                                    (uVar2,pbVar9,local_4a0,local_4c8);
                              std::__cxx11::string::~string(local_4c8);
                              std::allocator<char>::~allocator((allocator<char> *)&local_4c9);
                              std::__cxx11::string::~string(local_4a0);
                              std::allocator<char>::~allocator((allocator<char> *)&local_4a1);
                              *(Attribute **)((long)local_70 + local_d8 * 8) = local_110;
                            }
                            else {
                              DVar4 = adios2::helper::GetDataType<long_double>();
                              uVar2 = local_60;
                              pbVar9 = local_f8;
                              DVar5 = local_104;
                              if (DVar1 == DVar4) {
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string(local_4f0,"",&local_4f1);
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string(local_518,"/",&local_519);
                                local_110 = adios2::core::IO::InquireAttribute<long_double>
                                                      (uVar2,pbVar9,local_4f0,local_518);
                                std::__cxx11::string::~string(local_518);
                                std::allocator<char>::~allocator((allocator<char> *)&local_519);
                                std::__cxx11::string::~string(local_4f0);
                                std::allocator<char>::~allocator((allocator<char> *)&local_4f1);
                                *(Attribute **)((long)local_70 + local_d8 * 8) = local_110;
                              }
                              else {
                                DVar4 = adios2::helper::GetDataType<std::complex<float>>();
                                uVar2 = local_60;
                                pbVar9 = local_f8;
                                DVar1 = local_104;
                                if (DVar5 == DVar4) {
                                  std::allocator<char>::allocator();
                                  std::__cxx11::string::string(local_540,"",&local_541);
                                  std::allocator<char>::allocator();
                                  std::__cxx11::string::string(local_568,"/",&local_569);
                                  local_110 = adios2::core::IO::
                                              InquireAttribute<std::complex<float>>
                                                        (uVar2,pbVar9,local_540,local_568);
                                  std::__cxx11::string::~string(local_568);
                                  std::allocator<char>::~allocator((allocator<char> *)&local_569);
                                  std::__cxx11::string::~string(local_540);
                                  std::allocator<char>::~allocator((allocator<char> *)&local_541);
                                  *(Attribute **)((long)local_70 + local_d8 * 8) = local_110;
                                }
                                else {
                                  DVar5 = adios2::helper::GetDataType<std::complex<double>>();
                                  uVar2 = local_60;
                                  if (DVar1 == DVar5) {
                                    paVar10 = &local_591;
                                    pbVar9 = local_f8;
                                    std::allocator<char>::allocator();
                                    std::__cxx11::string::string(local_590,"",paVar10);
                                    std::allocator<char>::allocator();
                                    std::__cxx11::string::string(local_5b8,"/",&local_5b9);
                                    local_110 = adios2::core::IO::
                                                InquireAttribute<std::complex<double>>
                                                          (uVar2,pbVar9,local_590,local_5b8);
                                    std::__cxx11::string::~string(local_5b8);
                                    std::allocator<char>::~allocator((allocator<char> *)&local_5b9);
                                    std::__cxx11::string::~string(local_590);
                                    std::allocator<char>::~allocator((allocator<char> *)&local_591);
                                    *(Attribute **)((long)local_70 + local_d8 * 8) = local_110;
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    local_d8 = local_d8 + 1;
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(in_stack_fffffffffffff790);
  }
  *local_10 = local_70;
  local_4 = adios2_error_none;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x14e62b);
  return local_4;
}

Assistant:

adios2_error adios2_inquire_all_attributes(adios2_attribute ***attributes, size_t *size,
                                           adios2_io *io)
{
    try
    {
        adios2::helper::CheckForNullptr(io,
                                        "for adios2_io, in call to adios2_inquire_all_attributes");

        adios2::core::IO &ioCpp = *reinterpret_cast<adios2::core::IO *>(io);
        const auto &dataMap = ioCpp.GetAttributes();

        *size = dataMap.size();
        adios2_attribute **list = (adios2_attribute **)calloc(*size, sizeof(adios2_attribute *));

        // Sort the names so that we return the same order as the
        // C++, python APIs
        std::set<std::string> names;
        for (auto &it : dataMap)
            names.insert(it.first);

        size_t n = 0;
        for (auto &name : names)
        {
            auto it = dataMap.find(name);
            const adios2::DataType type(it->second->m_Type);
            adios2::core::AttributeBase *attribute = nullptr;

            if (type == adios2::DataType::Struct)
            {
                // not supported
            }
#define declare_template_instantiation(T)                                                          \
    else if (type == adios2::helper::GetDataType<T>())                                             \
    {                                                                                              \
        attribute = ioCpp.InquireAttribute<T>(name);                                               \
        list[n] = reinterpret_cast<adios2_attribute *>(attribute);                                 \
    }
            ADIOS2_FOREACH_ATTRIBUTE_STDTYPE_1ARG(declare_template_instantiation)
#undef declare_template_instantiation

            n++;
        }
        *attributes = list;
        return adios2_error_none;
    }
    catch (...)
    {
        return static_cast<adios2_error>(
            adios2::helper::ExceptionToError("adios2_inquire_all_attributes"));
    }
}